

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 computeNumericType(Mem *pMem)

{
  int iVar1;
  Mem *pMem_local;
  
  iVar1 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
  if (iVar1 == 0) {
    pMem_local._6_2_ = 0;
  }
  else {
    iVar1 = sqlite3Atoi64(pMem->z,(i64 *)pMem,pMem->n,pMem->enc);
    if (iVar1 == 0) {
      pMem_local._6_2_ = 4;
    }
    else {
      pMem_local._6_2_ = 8;
    }
  }
  return pMem_local._6_2_;
}

Assistant:

static u16 SQLITE_NOINLINE computeNumericType(Mem *pMem){
  assert( (pMem->flags & (MEM_Int|MEM_Real))==0 );
  assert( (pMem->flags & (MEM_Str|MEM_Blob))!=0 );
  if( sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc)==0 ){
    return 0;
  }
  if( sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc)==SQLITE_OK ){
    return MEM_Int;
  }
  return MEM_Real;
}